

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

Result __thiscall
testing::internal::FunctionMockerBase<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>::
PerformDefaultAction
          (FunctionMockerBase<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)> *this,
          ArgumentTuple *args,string *call_description)

{
  IDType IVar1;
  pointer pcVar2;
  bool bVar3;
  Result RVar4;
  Action<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)> *this_00;
  runtime_error *this_01;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar5;
  OnCallSpec<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)> *this_02;
  string message;
  long *local_50 [2];
  long local_40 [2];
  
  ppvVar5 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar5 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      this_02 = (OnCallSpec<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)> *)0x0;
      break;
    }
    this_02 = (OnCallSpec<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)> *)ppvVar5[-1]
    ;
    ppvVar5 = ppvVar5 + -1;
    bVar3 = OnCallSpec<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>::Matches
                      (this_02,args);
  } while (!bVar3);
  if (this_02 != (OnCallSpec<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)> *)0x0) {
    this_00 = OnCallSpec<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>::GetAction
                        (this_02);
    RVar4 = Action<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>::Perform
                      (this_00,args);
    return (Result)RVar4.id_;
  }
  pcVar2 = (call_description->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)local_50);
  if (DefaultValue<TestExprBuilder<4,BasicTestExpr<2>>>::value_ != (IDType *)0x0) {
    IVar1 = *DefaultValue<TestExprBuilder<4,BasicTestExpr<2>>>::value_;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    return (Result)IVar1;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,(string *)local_50);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }